

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::DefaultSampling<int>::genFixeds
          (DefaultSampling<int> *this,FloatFormat *param_1,vector<int,_std::allocator<int>_> *dst)

{
  value_type_conflict5 local_2c [3];
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *dst_local;
  FloatFormat *param_1_local;
  DefaultSampling<int> *this_local;
  
  local_2c[2] = 0;
  local_20 = dst;
  dst_local = (vector<int,_std::allocator<int>_> *)param_1;
  param_1_local = (FloatFormat *)this;
  std::vector<int,_std::allocator<int>_>::push_back(dst,local_2c + 2);
  local_2c[1] = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::push_back(local_20,local_2c + 1);
  local_2c[0] = 1;
  std::vector<int,_std::allocator<int>_>::push_back(local_20,local_2c);
  return;
}

Assistant:

void	genFixeds	(const FloatFormat&, vector<int>& dst) const
	{
		dst.push_back(0);
		dst.push_back(-1);
		dst.push_back(1);
	}